

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefUse.cpp
# Opt level: O2

bool __thiscall
dg::LLVMDefUseAnalysis::runOnNode(LLVMDefUseAnalysis *this,LLVMNode *node,LLVMNode *param_2)

{
  User *this_00;
  LLVMDependenceGraph *this_01;
  bool bVar1;
  Use *pUVar2;
  const_op_iterator pUVar3;
  LLVMNode *this_02;
  _Base_ptr p_Var4;
  
  this_00 = (User *)(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
  if ((this_00 != (User *)0x0) && (0x1a < (byte)this_00[0x10])) {
    this_01 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg;
    pUVar2 = llvm::User::getOperandList(this_00);
    pUVar3 = llvm::User::op_end(this_00);
    for (; pUVar2 != pUVar3; pUVar2 = pUVar2 + 0x20) {
      this_02 = DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                          (&this_01->super_DependenceGraph<dg::LLVMNode>,*(Value **)pUVar2);
      if (this_02 != (LLVMNode *)0x0) {
        if (((this_02->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs.
             _M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           (*(char *)(*(long *)(this_02->
                               super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key
                     + 8) != '\a')) {
          for (p_Var4 = (this_02->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                        subgraphs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 !=
              &(this_02->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs
               ._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addDataDependence
                      (*(Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> **)
                        (*(long *)(p_Var4 + 1) + 0x20),node);
          }
        }
        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addUseDependence
                  (&this_02->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,node);
      }
    }
  }
  bVar1 = dda::LLVMDataDependenceAnalysis::isUse(this->RD,(Value *)this_00);
  if (bVar1) {
    addDataDependencies(this,node);
  }
  return false;
}

Assistant:

bool LLVMDefUseAnalysis::runOnNode(LLVMNode *node, LLVMNode * /*prev*/) {
    Value *val = node->getKey();

    // just add direct def-use edges to every instruction
    if (auto *I = dyn_cast<Instruction>(val))
        handleOperands(I, node);

    if (RD->isUse(val)) {
        addDataDependencies(node);
    }

    // we will run only once
    return false;
}